

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::do_timer(Server *this)

{
  int iVar1;
  undefined1 local_30 [8];
  itimerspec it;
  Server *this_local;
  
  it.it_value.tv_nsec = (__syscall_slong_t)this;
  iVar1 = timerfd_create(1,0x800);
  this->timer_fd = iVar1;
  if (this->timer_fd < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0x4b);
    fprintf(_stderr,"--> %s\n","this->timer_fd");
    perror("info");
    exit(1);
  }
  iVar1 = clock_gettime(1,(timespec *)&it.it_interval.tv_nsec);
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0x4d);
    fprintf(_stderr,"--> %s\n","clock_gettime(CLOCK_MONOTONIC, &it.it_value)");
    perror("info");
    exit(1);
  }
  it.it_interval.tv_nsec = 1;
  it.it_value.tv_sec = 0;
  local_30 = (undefined1  [8])0x1;
  it.it_interval.tv_sec = 0;
  timerfd_settime(this->timer_fd,0,(itimerspec *)local_30,(itimerspec *)0x0);
  return;
}

Assistant:

void Server::do_timer() {
    this->timer_fd = timerfd_create(CLOCK_MONOTONIC, TFD_NONBLOCK);
    IF_NEGATIVE_EXIT(this->timer_fd);
    struct itimerspec it;
    IF_NEGATIVE_EXIT(clock_gettime(CLOCK_MONOTONIC, &it.it_value));
    it.it_value.tv_sec = 1;
    it.it_value.tv_nsec = 0;
    it.it_interval.tv_sec = 1;
    it.it_interval.tv_nsec = 0;
    timerfd_settime(this->timer_fd, 0, &it, NULL);
}